

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O3

void __thiscall CCNR::ls_solver::update_cc_after_flip(ls_solver *this,int flipv)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  int *piVar4;
  iterator __position;
  bool bVar5;
  pointer pvVar6;
  pointer piVar7;
  longlong lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  int v;
  int local_2c;
  
  pvVar6 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>._M_impl
           .super__Vector_impl_data._M_start;
  pvVar6[flipv].cc_value = false;
  piVar3 = (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar9 = (int)((ulong)((long)piVar7 - (long)piVar3) >> 2) - 1;
  if (-1 < (int)uVar9) {
    lVar8 = this->_mems;
    lVar10 = (ulong)uVar9 + 1;
    do {
      iVar1 = piVar3[lVar10 + -1];
      if (pvVar6[iVar1].score < 1) {
        iVar2 = piVar7[-1];
        piVar7 = piVar7 + -1;
        (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar7;
        piVar3[lVar10 + -1] = iVar2;
        lVar8 = lVar8 + 1;
        this->_mems = lVar8;
        pvVar6[iVar1].is_in_ccd_vars = false;
      }
      lVar11 = lVar10 + -1;
      bVar5 = 0 < lVar10;
      lVar10 = lVar11;
    } while (lVar11 != 0 && bVar5);
  }
  piVar12 = pvVar6[flipv].neighbor_var_nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar4 = *(pointer *)
            ((long)&pvVar6[flipv].neighbor_var_nums.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl + 8);
  if (piVar12 != piVar4) {
    do {
      local_2c = *piVar12;
      pvVar6[local_2c].cc_value = true;
      if ((0 < pvVar6[local_2c].score) && (pvVar6[local_2c].is_in_ccd_vars == false)) {
        __position._M_current =
             (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->_ccd_vars,__position,&local_2c);
          pvVar6 = (this->_vars).super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *__position._M_current = local_2c;
          (this->_ccd_vars).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        this->_mems = this->_mems + 1;
        pvVar6[local_2c].is_in_ccd_vars = true;
      }
      piVar12 = piVar12 + 1;
    } while (piVar12 != piVar4);
  }
  return;
}

Assistant:

void ls_solver::update_cc_after_flip(int flipv)
{
    int index, v, last_item;
    variable *vp = &(_vars[flipv]);
    vp->cc_value = 0;
    for (index = _ccd_vars.size() - 1; index >= 0; index--) {
        v = _ccd_vars[index];
        if (_vars[v].score <= 0) {
            last_item = _ccd_vars.back();
            _ccd_vars.pop_back();
            _ccd_vars[index] = last_item;
            _mems++;
            _vars[v].is_in_ccd_vars = 0;
        }
    }
    // update all flipv's neighbor's cc to be 1
    for (int v : vp->neighbor_var_nums) {
        _vars[v].cc_value = 1;
        if (_vars[v].score > 0 && !(_vars[v].is_in_ccd_vars)) {
            _ccd_vars.push_back(v);
            _mems++;
            _vars[v].is_in_ccd_vars = 1;
        }
    }
}